

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O2

void __thiscall CVmObjTimeZone::save_to_file(CVmObjTimeZone *this,CVmFile *fp)

{
  CVmTimeZone *this_00;
  char *str;
  size_t namelen;
  vmtzquery q;
  size_t local_40;
  vmtzquery local_38;
  
  this_00 = *(CVmTimeZone **)(this->super_CVmObject).ext_;
  str = CVmTimeZone::get_name(this_00,&local_40);
  if (G_tzcache_X->local_zone_ == this_00) {
    local_40 = 6;
    str = ":local";
  }
  CVmTimeZone::query(this_00,&local_38);
  CVmFile::write_int4(fp,local_38.gmtofs);
  CVmFile::write_int4(fp,local_38.save);
  CVmFile::write_str_byte_prefix(fp,local_38.abbr);
  CVmFile::write_str_byte_prefix(fp,str,local_40);
  return;
}

Assistant:

void CVmObjTimeZone::save_to_file(VMG_ class CVmFile *fp)
{
    /* get our timezone name */
    CVmTimeZone *tz = get_ext()->tz;
    size_t namelen;
    const char *name = tz->get_name(namelen);

    /* if this is the system's local zone, use ":local" as the name */
    if (G_tzcache->is_local_zone(tz))
        name = ":local", namelen = 6;

    /* query the zone data */
    vmtzquery q;
    tz->query(&q);

    /* write our GMT offset, DST offset, abbreviation, and timezone name */
    fp->write_int4(q.gmtofs);
    fp->write_int4(q.save);
    fp->write_str_byte_prefix(q.abbr);
    fp->write_str_byte_prefix(name, namelen);
}